

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O1

int __thiscall
CVmObjTemporaryFile::getp_deleteFile
          (CVmObjTemporaryFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *__filename;
  int iVar1;
  
  if (getp_deleteFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_deleteFile();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_deleteFile::desc);
  if (iVar1 == 0) {
    __filename = (this->super_CVmObject).ext_;
    if (*__filename != '\0') {
      remove(__filename);
    }
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjTemporaryFile::getp_deleteFile(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* if we have a filename, delete the file */
    vm_tmpfil_ext *ext = get_ext();
    if (ext->filename[0] != '\0')
    {
        /* delete the system file */
        osfdel(ext->filename);
    }

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}